

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O0

lzma_ret lzma_delta_coder_init
                   (lzma_next_coder_conflict *next,lzma_allocator *allocator,
                   lzma_filter_info *filters)

{
  lzma_coder_conflict *plVar1;
  uint64_t uVar2;
  lzma_options_delta *opt;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict *next_local;
  
  if (next->coder == (lzma_coder_conflict *)0x0) {
    plVar1 = (lzma_coder_conflict *)lzma_alloc(0x150,allocator);
    next->coder = plVar1;
    if (next->coder == (lzma_coder_conflict *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->end = delta_coder_end;
    memcpy(next->coder,&LZMA_NEXT_CODER_INIT,0x40);
  }
  uVar2 = lzma_delta_coder_memusage(filters->options);
  if (uVar2 == 0xffffffffffffffff) {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  else {
    *(ulong *)&next->coder->sequence = (ulong)*(uint *)((long)filters->options + 4);
    *(undefined1 *)&next->coder->header_pos = 0;
    memset((void *)((long)&next->coder->header_pos + 1),0,0x100);
    next_local._4_4_ = lzma_next_filter_init((lzma_next_coder *)next->coder,allocator,filters + 1);
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_delta_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters)
{
	const lzma_options_delta *opt;

	// Allocate memory for the decoder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		// End function is the same for encoder and decoder.
		next->end = &delta_coder_end;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Validate the options.
	if (lzma_delta_coder_memusage(filters[0].options) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Set the delta distance.
	opt = filters[0].options;
	next->coder->distance = opt->dist;

	// Initialize the rest of the variables.
	next->coder->pos = 0;
	memzero(next->coder->history, LZMA_DELTA_DIST_MAX);

	// Initialize the next decoder in the chain, if any.
	return lzma_next_filter_init(&next->coder->next,
			allocator, filters + 1);
}